

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::ExtensionSet::RegisterExtension
               (MessageLite *containing_type,int number,FieldType type,bool is_repeated,
               bool is_packed)

{
  byte in_CL;
  FieldType in_DL;
  byte in_R8B;
  ExtensionInfo info;
  LogMessage *in_stack_fffffffffffffe88;
  LogMessage *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffea0;
  ExtensionInfo local_100;
  byte local_d9;
  byte local_99;
  int in_stack_ffffffffffffff6c;
  MessageLite *in_stack_ffffffffffffff70;
  ExtensionInfo in_stack_ffffffffffffff80;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  if (in_DL == '\x0e') {
    LogMessage::LogMessage
              (in_stack_fffffffffffffea0,level,(char *)in_stack_fffffffffffffe90,
               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    LogMessage::operator<<(in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88);
    LogFinisher::operator=((LogFinisher *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    LogMessage::~LogMessage((LogMessage *)0x48be0c);
  }
  local_99 = 0;
  if (in_DL == '\v') {
    LogMessage::LogMessage
              (in_stack_fffffffffffffea0,level,(char *)in_stack_fffffffffffffe90,
               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    local_99 = 1;
    LogMessage::operator<<(in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88);
    LogFinisher::operator=((LogFinisher *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  if ((local_99 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x48be95);
  }
  local_d9 = 0;
  if (in_DL == '\n') {
    LogMessage::LogMessage
              (in_stack_fffffffffffffea0,level,(char *)in_stack_fffffffffffffe90,
               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    local_d9 = 1;
    LogMessage::operator<<(in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88);
    LogFinisher::operator=((LogFinisher *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  if ((local_d9 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x48bf1e);
  }
  ExtensionInfo::ExtensionInfo(&local_100,in_DL,(bool)(in_CL & 1),(bool)(in_R8B & 1));
  anon_unknown_19::Register
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff80);
  return;
}

Assistant:

void ExtensionSet::RegisterExtension(const MessageLite* containing_type,
                                     int number, FieldType type,
                                     bool is_repeated, bool is_packed) {
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_ENUM);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_MESSAGE);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(type, is_repeated, is_packed);
  Register(containing_type, number, info);
}